

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void pmevtyper_rawwrite(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  long lVar1;
  uint64_t uVar2;
  
  lVar1 = (ulong)(ri->opc2 & 7) + (ulong)(ri->crm & 3) * 8;
  (env->cp15).c14_pmevtyper[lVar1] = value;
  if (((ushort)value < 0x3d) && (supported_event_map[(uint)value & 0x3f] != 0xffff)) {
    uVar2 = (*pm_events[supported_event_map[(uint)value & 0x3f]].get_count)(env);
    (env->cp15).c14_pmevcntr_delta[lVar1] = uVar2;
  }
  return;
}

Assistant:

static void pmevtyper_rawwrite(CPUARMState *env, const ARMCPRegInfo *ri,
                               uint64_t value)
{
    uint8_t counter = ((ri->crm & 3) << 3) | (ri->opc2 & 7);
    env->cp15.c14_pmevtyper[counter] = value;

    /*
     * pmevtyper_rawwrite is called between a pair of pmu_op_start and
     * pmu_op_finish calls when loading saved state for a migration. Because
     * we're potentially updating the type of event here, the value written to
     * c14_pmevcntr_delta by the preceeding pmu_op_start call may be for a
     * different counter type. Therefore, we need to set this value to the
     * current count for the counter type we're writing so that pmu_op_finish
     * has the correct count for its calculation.
     */
    uint16_t event = value & PMXEVTYPER_EVTCOUNT;
    if (event_supported(event)) {
        uint16_t event_idx = supported_event_map[event];
        env->cp15.c14_pmevcntr_delta[counter] =
            pm_events[event_idx].get_count(env);
    }
}